

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
tf::SmallVector<int,_2U>::SmallVector(SmallVector<int,_2U> *this,initializer_list<int> IL)

{
  *(undefined1 **)this = &this->field_0x18;
  *(undefined1 **)&this->field_0x8 = &this->field_0x18;
  *(SmallVector<int,_2U> **)&this->field_0x10 = this + 1;
  SmallVectorImpl<int>::append<int_const*>
            ((SmallVectorImpl<int> *)this,IL._M_array,IL._M_array + IL._M_len);
  return;
}

Assistant:

SmallVector(std::initializer_list<T> IL) : SmallVectorImpl<T>(N) {
    this->assign(IL);
  }